

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O1

void __thiscall psy::C::SemanticModelTester::case0150(SemanticModelTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TypeKind TVar2;
  DeclarationCategory DVar3;
  SymbolKind SVar4;
  int iVar5;
  FunctionDeclarationSymbol *this_00;
  Lexeme *pLVar6;
  Type *pTVar7;
  undefined4 extraout_var;
  FunctionDeclarationSymbol *this_01;
  ostream *poVar8;
  undefined8 uVar9;
  string local_70;
  undefined1 local_50 [16];
  size_type *local_40;
  size_type local_30 [2];
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"void x ( ) { }","");
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  compile<psy::C::FunctionDefinitionSyntax>
            ((SemanticModelTester *)local_50,(string *)this,&local_70);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  this_00 = SemanticModel::functionFor
                      ((SemanticModel *)local_50._0_8_,(FunctionDefinitionSyntax *)local_50._8_8_);
  if (this_00 == (FunctionDeclarationSymbol *)0x0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
    poVar8 = std::operator<<(poVar8,"true");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    iVar5 = 0x150;
  }
  else {
    pLVar6 = &FunctionDeclarationSymbol::name(this_00)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_70,pLVar6);
    iVar5 = std::__cxx11::string::compare((char *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (iVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      pLVar6 = &FunctionDeclarationSymbol::name(this_00)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_70,pLVar6);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tExpected: ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x151);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_70);
      goto LAB_003e943a;
    }
    pTVar7 = FunctionDeclarationSymbol::type(this_00);
    TVar2 = Type::kind(pTVar7);
    if (TVar2 == Function) {
      iVar5 = (*((*(DeclaratorSyntax **)(local_50._8_8_ + 0x30))->super_SyntaxNode).super_Managed.
                _vptr_Managed[0x57])();
      this_01 = (FunctionDeclarationSymbol *)
                SemanticModel::declarationBy
                          ((SemanticModel *)local_50._0_8_,
                           (DeclaratorSyntax *)CONCAT44(extraout_var,iVar5));
      if (this_01 == (FunctionDeclarationSymbol *)0x0) {
        poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
        poVar8 = std::operator<<(poVar8,"true");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"\t\t");
        poVar8 = std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                );
        poVar8 = std::operator<<(poVar8,":");
        iVar5 = 0x157;
      }
      else {
        DVar3 = DeclarationSymbol::category((DeclarationSymbol *)this_01);
        if (DVar3 == Function) {
          SVar4 = Symbol::kind((Symbol *)this_01);
          if (SVar4 == FunctionDeclaration) {
            if (this_01 == this_00) {
              return;
            }
            poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
            poVar8 = C::operator<<(poVar8,(DeclarationSymbol *)this_01);
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
            poVar8 = C::operator<<(poVar8,this_00);
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"\t\t");
            poVar8 = std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                    );
            poVar8 = std::operator<<(poVar8,":");
            iVar5 = 0x15a;
          }
          else {
            poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
            poVar8 = std::operator<<(poVar8,"true");
            poVar8 = std::operator<<(poVar8,"\n");
            poVar8 = std::operator<<(poVar8,"\t\t");
            poVar8 = std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                    );
            poVar8 = std::operator<<(poVar8,":");
            iVar5 = 0x159;
          }
        }
        else {
          poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
          poVar8 = std::operator<<(poVar8,"true");
          poVar8 = std::operator<<(poVar8,"\n");
          poVar8 = std::operator<<(poVar8,"\t\t");
          poVar8 = std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                  );
          poVar8 = std::operator<<(poVar8,":");
          iVar5 = 0x158;
        }
      }
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
      pTVar7 = FunctionDeclarationSymbol::type(this_00);
      TVar2 = Type::kind(pTVar7);
      poVar8 = ::operator<<(poVar8,TVar2);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
      poVar8 = ::operator<<(poVar8,Function);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\t");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      iVar5 = 0x152;
    }
  }
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar5);
  std::endl<char,std::char_traits<char>>(poVar8);
LAB_003e943a:
  uVar9 = __cxa_allocate_exception(1);
  __cxa_throw(uVar9,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0150()
{
    auto [funcDefNode, semaModel] =
            compile<FunctionDefinitionSyntax>("void x ( ) { }");

    const FunctionDeclarationSymbol* funcDeclSym = semaModel->functionFor(funcDefNode);
    PSY_EXPECT_TRUE(funcDeclSym);
    PSY_EXPECT_EQ_STR(funcDeclSym->name()->valueText(), "x");
    PSY_EXPECT_EQ_ENU(funcDeclSym->type()->kind(), TypeKind::Function, TypeKind);

    auto decltor = funcDefNode->declarator();
    auto arrOrFunDecltor = decltor->asArrayOrFunctionDeclarator();
    const DeclarationSymbol* declSym = semaModel->declarationBy(arrOrFunDecltor);
    PSY_EXPECT_TRUE(declSym);
    PSY_EXPECT_TRUE(declSym->category() == DeclarationCategory::Function);
    PSY_EXPECT_TRUE(declSym->kind() == SymbolKind::FunctionDeclaration);
    PSY_EXPECT_EQ_PTR(declSym, funcDeclSym);
}